

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

int __thiscall
embree::TutorialBenchmark::main(TutorialBenchmark *this,int argc,char **argv,string *name)

{
  bool bVar1;
  int iVar2;
  char **ppcVar3;
  string *in_RCX;
  string *in_RDI;
  char **unaff_retaddr;
  int in_stack_0000000c;
  CommandLineParser *in_stack_00000010;
  string benchmark_name;
  CommandLine commandLine;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  string *path;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [55];
  allocator local_71;
  char **in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  CommandLine *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  TutorialBenchmark *in_stack_ffffffffffffffb0;
  string local_28;
  
  CommandLineParser::parseCommandLine(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  updateCommandLine(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                    (char **)in_stack_ffffffffffffffa0);
  path = &local_28;
  CommandLine::CommandLine
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
  local_28.field_2._12_4_ = CommandLine::argc((CommandLine *)0x54d735);
  local_28.field_2._M_allocated_capacity = (size_type)CommandLine::argv((CommandLine *)0x54d746);
  CommandLine::CommandLine
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
  (*(code *)**(undefined8 **)in_RDI)();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,(string *)in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff90,".xml",&local_71);
  bVar1 = endsWith(in_RDI,in_RCX);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if (bVar1) {
    getFileName(path);
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffb0,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,".ecs",&local_c9);
    bVar1 = endsWith(in_RDI,in_RCX);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    if (bVar1) {
      getFileName(path);
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffffb0,local_f0);
      std::__cxx11::string::~string(local_f0);
    }
  }
  bVar1 = std::operator!=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffb0,(string *)(in_RDI + 5));
  }
  iVar2 = CommandLine::argc((CommandLine *)0x54d9f2);
  ppcVar3 = CommandLine::argv((CommandLine *)0x54da05);
  (**(code **)(*(long *)in_RDI + 8))(in_RDI,&stack0xffffffffffffffb0,iVar2,ppcVar3);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return 0;
}

Assistant:

int TutorialBenchmark::main(int argc, char** argv, std::string name)
{
  commandLineParser.parseCommandLine(argc, argv);
  updateCommandLine(argc, argv);

  CommandLine commandLine(argc, argv);

#if USE_GOOGLE_BENCHMARK
  if (!params.legacy && params.minTimeOrIterations > 0)
    commandLine.add({"--benchmark_min_time=" + std::to_string(params.minTimeOrIterations)});
  if (!params.legacy && params.repetitions > 0)
    commandLine.add({"--benchmark_repetitions=" + std::to_string(params.repetitions)});
#endif

  argc = commandLine.argc();
  argv = commandLine.argv();

#ifdef USE_GOOGLE_BENCHMARK
  if (!params.legacy)
    ::benchmark::Initialize(&argc, argv);
#endif

  commandLine = CommandLine(argc, argv);

  postParseCommandLine();

  std::string benchmark_name = name;
  if (endsWith(inputFile, ".xml")) {
    benchmark_name = getFileName(inputFile);
  }
  else if (endsWith(inputFile, ".ecs")) {
    benchmark_name = getFileName(inputFile);
  }

  if (params.name != "")
    benchmark_name = params.name;

  registerBenchmark(benchmark_name, commandLine.argc(), commandLine.argv());

#ifdef USE_GOOGLE_BENCHMARK
  if (!params.legacy)
    ::benchmark::RunSpecifiedBenchmarks();
#endif

  return 0;
}